

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  ulong uVar4;
  Expr *pEVar5;
  Table *pTVar6;
  Mem *pMVar7;
  char *pcVar8;
  ushort uVar9;
  long lVar10;
  int idx;
  Select *pSVar11;
  code *xDel;
  ExprList_item *pEVar12;
  long lVar13;
  long in_FS_OFFSET;
  char *zOrigTab;
  char *zOrigDb;
  NameContext sNC;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_78 [40];
  undefined1 *puStack_50;
  Select *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pParse->colNamesSet == '\0') {
    db = pParse->db;
    pVVar1 = pParse->pVdbe;
    do {
      pSVar11 = pSelect;
      pSelect = pSVar11->pPrior;
    } while (pSVar11->pPrior != (Select *)0x0);
    pEVar2 = pSVar11->pEList;
    pSVar3 = pSVar11->pSrc;
    pParse->colNamesSet = '\x01';
    uVar4 = db->flags;
    sqlite3VdbeSetNumCols(pVVar1,pEVar2->nExpr);
    if (0 < pEVar2->nExpr) {
      pEVar12 = pEVar2->a;
      lVar10 = 0;
      lVar13 = 0;
      do {
        pEVar5 = pEVar12->pExpr;
        pcVar8 = pEVar12->zEName;
        if ((pcVar8 == (char *)0x0) || (((pEVar12->fg).field_0x1 & 3) != 0)) {
          if (((uVar4 & 0x44) == 0) || (pEVar5->op != 0xa8)) {
            if (pcVar8 == (char *)0x0) {
              pcVar8 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar13 + 1));
            }
            else {
              pcVar8 = sqlite3DbStrDup(db,pcVar8);
            }
          }
          else {
            uVar9 = pEVar5->iColumn;
            pTVar6 = (pEVar5->y).pTab;
            if ((short)uVar9 < 0) {
              uVar9 = pTVar6->iPKey;
            }
            pcVar8 = "rowid";
            if (-1 < (short)uVar9) {
              pcVar8 = pTVar6->aCol[uVar9].zCnName;
            }
            if ((uVar4 & 4) == 0) {
              if (pVVar1->db->mallocFailed == '\0') {
                pMVar7 = pVVar1->aColName;
                goto LAB_00189a80;
              }
              goto LAB_00189af0;
            }
            pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar6->zName);
          }
          if (pVVar1->db->mallocFailed == '\0') {
            pMVar7 = pVVar1->aColName;
            xDel = sqlite3OomClear;
LAB_00189aeb:
            sqlite3VdbeMemSetStr((Mem *)((long)&pMVar7->u + lVar10),pcVar8,-1,'\x01',xDel);
          }
        }
        else if (pVVar1->db->mallocFailed == '\0') {
          pMVar7 = pVVar1->aColName;
LAB_00189a80:
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
          goto LAB_00189aeb;
        }
LAB_00189af0:
        lVar13 = lVar13 + 1;
        pEVar12 = pEVar12 + 1;
        lVar10 = lVar10 + 0x38;
      } while (lVar13 < pEVar2->nExpr);
    }
    pVVar1 = pParse->pVdbe;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = (NameContext *)0x0;
    local_78._0_8_ = pParse;
    local_78._8_8_ = pSVar3;
    if (0 < pEVar2->nExpr) {
      pEVar12 = pEVar2->a;
      lVar13 = 0;
      lVar10 = 0;
      do {
        local_80 = (char *)0x0;
        local_88 = (char *)0x0;
        local_90 = (char *)0x0;
        pcVar8 = columnTypeImpl((NameContext *)local_78,pEVar12->pExpr,&local_80,&local_88,&local_90
                               );
        idx = (int)lVar10;
        sqlite3VdbeSetColName(pVVar1,idx,2,local_80,(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3VdbeSetColName(pVVar1,idx,3,local_88,(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3VdbeSetColName(pVVar1,idx,4,local_90,(_func_void_void_ptr *)0xffffffffffffffff);
        if (pVVar1->db->mallocFailed == '\0') {
          sqlite3VdbeMemSetStr
                    ((Mem *)((long)&pVVar1->aColName[pVVar1->nResAlloc].u + lVar13),pcVar8,-1,'\x01'
                     ,(_func_void_void_ptr *)0xffffffffffffffff);
        }
        lVar10 = lVar10 + 1;
        lVar13 = lVar13 + 0x38;
        pEVar12 = pEVar12 + 1;
      } while (lVar10 < pEVar2->nExpr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}